

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

QDBusArgument qvariant_cast<QDBusArgument>(QVariant *v)

{
  bool bVar1;
  QMetaType QVar2;
  QDBusArgumentPrivate *in_RSI;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusArgument>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&in_RSI[0x18].field_0x0 & 0xfffffffffffffffc);
  bVar1 = comparesEqual(&local_28,&local_20);
  if (bVar1) {
    if ((*(long *)&in_RSI[0x18].field_0x0 & 1) != 0) {
      in_RSI = *in_RSI + *(int *)(*in_RSI + 4);
    }
    QDBusArgument::QDBusArgument((QDBusArgument *)v,(QDBusArgument *)in_RSI);
  }
  else {
    (v->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QDBusArgument::QDBusArgument((QDBusArgument *)v);
    QVar2.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if ((*(long *)&in_RSI[0x18].field_0x0 & 1) != 0) {
      in_RSI = *in_RSI + *(int *)(*in_RSI + 4);
    }
    QMetaType::convert(QVar2,in_RSI,local_20,v);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QDBusArgument)(QDBusArgumentPrivate *)v;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}